

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_CodePrinter.h
# Opt level: O2

CodePrinter * __thiscall choc::text::CodePrinter::operator<<(CodePrinter *this,uint v)

{
  string local_30;
  
  std::__cxx11::to_string(&local_30,v);
  append(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return this;
}

Assistant:

CodePrinter& CodePrinter::operator<< (IntegerType v)
{
    static_assert (std::is_integral<IntegerType>::value, "You're probably trying to write a type that's not supported");
    append (std::to_string (v));
    return *this;
}